

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_dtd(void)

{
  ushort local_12;
  uint *puStack_10;
  DLword cnt;
  dtd *dtdp;
  
  puStack_10 = (uint *)(DTDspace + 0x12);
  for (local_12 = 0; local_12 < 0x4a; local_12 = local_12 + 1) {
    printf("DTD[ %d ] for ",(ulong)(local_12 + 1));
    print_atomname(*puStack_10 & 0xfffffff);
    putchar(10);
    printf("    dtd_name = %d\n",(ulong)(*puStack_10 & 0xfffffff));
    printf("    dtd_size = %d\n",(ulong)(ushort)puStack_10[1]);
    printf("    dtd_free = %d\n",(ulong)puStack_10[2]);
    printf("    dtd_obsolate = %d\n",(ulong)(*puStack_10 >> 0x1d & 1));
    printf("    dtd_finalizable = %d\n",(ulong)(*puStack_10 >> 0x1c & 1));
    printf("    dtd_lockedp = %d\n",(ulong)(puStack_10[3] >> 0x1f));
    printf("    dtd_hunkp = %d\n",(ulong)(puStack_10[3] >> 0x1e & 1));
    printf("    dtd_gctype = %d\n",(ulong)(puStack_10[3] >> 0x1c & 3));
    printf("    dtd_descrs = %d\n",(ulong)(puStack_10[3] & 0xfffffff));
    printf("    dtd_typespecs = %d\n",(ulong)puStack_10[4]);
    printf("    dtd_ptrs = %d\n",(ulong)puStack_10[5]);
    printf("    dtd_oldcnt = %d\n",(ulong)puStack_10[6]);
    printf("    dtd_cnt0 = %d\n",(ulong)*(ushort *)((long)puStack_10 + 6));
    printf("    dtd_nextpage = %d\n",(ulong)puStack_10[7]);
    printf("    dtd_typeentry = 0x%x\n",(ulong)*(ushort *)((long)puStack_10 + 0x22));
    printf("    dtd_supertype = %d\n",(ulong)(ushort)puStack_10[8]);
    puStack_10 = puStack_10 + 9;
  }
  return;
}

Assistant:

void dump_dtd(void) {
  struct dtd *dtdp;
  DLword cnt;

  dtdp = (struct dtd *)DTDspace;
  dtdp++;

  for (cnt = 0; cnt < INIT_TYPENUM; cnt++) {
    printf("DTD[ %d ] for ", cnt + 1);
#ifdef BIGVM
    print_atomname(dtdp->dtd_name);
#else
    print_atomname(dtdp->dtd_namelo + (dtdp->dtd_namehi << 16));
#endif /* BIGVM */
    putchar('\n');

#ifdef BIGVM
    printf("    dtd_name = %d\n", dtdp->dtd_name);
#else
    printf("    dtd_name = %d\n", dtdp->dtd_namelo + (dtdp->dtd_namehi << 16));
#endif /* BIGVM */
    printf("    dtd_size = %d\n", dtdp->dtd_size);
    printf("    dtd_free = %d\n", dtdp->dtd_free);
    printf("    dtd_obsolate = %d\n", dtdp->dtd_obsolate);
    printf("    dtd_finalizable = %d\n", dtdp->dtd_finalizable);
    printf("    dtd_lockedp = %d\n", dtdp->dtd_lockedp);
    printf("    dtd_hunkp = %d\n", dtdp->dtd_hunkp);
    printf("    dtd_gctype = %d\n", dtdp->dtd_gctype);
    printf("    dtd_descrs = %d\n", dtdp->dtd_descrs);
    printf("    dtd_typespecs = %d\n", dtdp->dtd_typespecs);
    printf("    dtd_ptrs = %d\n", dtdp->dtd_ptrs);
    printf("    dtd_oldcnt = %d\n", dtdp->dtd_oldcnt);
    printf("    dtd_cnt0 = %d\n", dtdp->dtd_cnt0);
    printf("    dtd_nextpage = %d\n", dtdp->dtd_nextpage);
    printf("    dtd_typeentry = 0x%x\n", dtdp->dtd_typeentry);
    printf("    dtd_supertype = %d\n", dtdp->dtd_supertype);

    dtdp++;
  }

}